

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_insert(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2,TCGv_i32 width,
               TCGv_i32 pos)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 ret_02;
  TCGv_i32 temp2;
  TCGv_i32 temp;
  TCGv_i32 mask;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 pos_local;
  TCGv_i32 width_local;
  TCGv_i32 r2_local;
  TCGv_i32 r1_local;
  TCGv_i32 ret_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  ret_01 = tcg_temp_new_i32(tcg_ctx_00);
  ret_02 = tcg_temp_new_i32(tcg_ctx_00);
  tcg_gen_movi_i32(tcg_ctx_00,ret_00,1);
  tcg_gen_shl_i32(tcg_ctx_00,ret_00,ret_00,width);
  tcg_gen_subi_i32_tricore(tcg_ctx_00,ret_00,ret_00,1);
  tcg_gen_shl_i32(tcg_ctx_00,ret_00,ret_00,pos);
  tcg_gen_shl_i32(tcg_ctx_00,ret_01,r2,pos);
  tcg_gen_and_i32(tcg_ctx_00,ret_01,ret_01,ret_00);
  tcg_gen_andc_i32_tricore(tcg_ctx_00,ret_02,r1,ret_00);
  tcg_gen_or_i32(tcg_ctx_00,ret,ret_01,ret_02);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i32(tcg_ctx_00,ret_01);
  tcg_temp_free_i32(tcg_ctx_00,ret_02);
  return;
}

Assistant:

static inline void gen_insert(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2, TCGv width, TCGv pos)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv mask = tcg_temp_new(tcg_ctx);
    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);

    tcg_gen_movi_tl(tcg_ctx, mask, 1);
    tcg_gen_shl_tl(tcg_ctx, mask, mask, width);
    tcg_gen_subi_tl(tcg_ctx, mask, mask, 1);
    tcg_gen_shl_tl(tcg_ctx, mask, mask, pos);

    tcg_gen_shl_tl(tcg_ctx, temp, r2, pos);
    tcg_gen_and_tl(tcg_ctx, temp, temp, mask);
    tcg_gen_andc_tl(tcg_ctx, temp2, r1, mask);
    tcg_gen_or_tl(tcg_ctx, ret, temp, temp2);

    tcg_temp_free(tcg_ctx, mask);
    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
}